

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_pairing.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>
::_remove_last(Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>
               *this,Pos_index columnIndex)

{
  pointer *ppPVar1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  ulong uVar4;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> _Var5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  __hash_code __code;
  
  if (this->isReduced_ == true) {
    uVar2 = (this->deathToBar_)._M_h._M_bucket_count;
    uVar4 = (ulong)columnIndex % uVar2;
    p_Var6 = (this->deathToBar_)._M_h._M_buckets[uVar4];
    p_Var7 = (__node_base_ptr)0x0;
    if ((p_Var6 != (__node_base_ptr)0x0) &&
       (p_Var3 = p_Var6->_M_nxt, p_Var7 = p_Var6,
       *(Pos_index *)&p_Var6->_M_nxt[1]._M_nxt != columnIndex)) {
      while (p_Var6 = p_Var3, p_Var3 = p_Var6->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
        p_Var7 = (__node_base_ptr)0x0;
        if (((ulong)*(uint *)&p_Var3[1]._M_nxt % uVar2 != uVar4) ||
           (p_Var7 = p_Var6, *(uint *)&p_Var3[1]._M_nxt == columnIndex)) goto LAB_00170506;
      }
      p_Var7 = (__node_base_ptr)0x0;
    }
LAB_00170506:
    if (p_Var7 == (__node_base_ptr)0x0) {
      _Var5._M_cur = (__node_type *)0x0;
    }
    else {
      _Var5._M_cur = (__node_type *)p_Var7->_M_nxt;
    }
    if (_Var5._M_cur == (__node_type *)0x0) {
      ppPVar1 = &(this->barcode_).
                 super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppPVar1 = *ppPVar1 + -1;
    }
    else {
      (this->barcode_).
      super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start[*(uint *)((long)_Var5._M_cur + 0xc)].death =
           0xffffffff;
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::erase(&(this->deathToBar_)._M_h,(const_iterator)_Var5._M_cur);
    }
  }
  uVar2 = (this->super_type).map_._M_h._M_bucket_count;
  uVar4 = (ulong)columnIndex % uVar2;
  p_Var6 = (this->super_type).map_._M_h._M_buckets[uVar4];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var6->_M_nxt, p_Var7 = p_Var6,
     *(Pos_index *)&p_Var6->_M_nxt[1]._M_nxt != columnIndex)) {
    while (p_Var6 = p_Var3, p_Var3 = p_Var6->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var3[1]._M_nxt % uVar2 != uVar4) ||
         (p_Var7 = p_Var6, *(uint *)&p_Var3[1]._M_nxt == columnIndex)) goto LAB_00170592;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_00170592:
  if (p_Var7 == (__node_base_ptr)0x0) {
    _Var5._M_cur = (__node_type *)0x0;
  }
  else {
    _Var5._M_cur = (__node_type *)p_Var7->_M_nxt;
  }
  if (_Var5._M_cur == (__node_type *)0x0) {
    return;
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(&(this->idToPosition_)._M_h,(long)_Var5._M_cur + 0xc);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::erase((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)this,(const_iterator)_Var5._M_cur);
  return;
}

Assistant:

inline void Base_pairing<Master_matrix>::_remove_last(Pos_index columnIndex) 
{
  static_assert(Master_matrix::Option_list::has_removable_columns, "remove_last not available.");

  if (isReduced_) {
    auto it = deathToBar_.find(columnIndex);

    if (it == deathToBar_.end()) {  // birth
      barcode_.pop_back();          // sorted by birth and columnIndex has to be the highest one
    } else {                        // death
      barcode_[it->second].death = Master_matrix::template get_null_value<Pos_index>();
      deathToBar_.erase(it);
    };
  }

  auto it = PIDM::map_.find(columnIndex);
  if (it != PIDM::map_.end()){
    idToPosition_.erase(it->second);
    PIDM::map_.erase(it);
  }
}